

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O0

ly_bool lyd_hash_table_val_equal(void *val1_p,void *val2_p,ly_bool mod,void *UNUSED_cb_data)

{
  lyd_node *node1;
  lyd_node *node2;
  LY_ERR LVar1;
  lyd_node *val2;
  lyd_node *val1;
  void *UNUSED_cb_data_local;
  ly_bool mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  node1 = *val1_p;
  node2 = *val2_p;
  if (mod == '\0') {
    if ((node1->schema->nodetype & 0x18) == 0) {
      if (node1->schema == node2->schema) {
        return '\x01';
      }
    }
    else {
      LVar1 = lyd_compare_single(node1,node2,0);
      if (LVar1 == LY_SUCCESS) {
        return '\x01';
      }
    }
    val1_p_local._7_1_ = '\0';
  }
  else if (node1 == node2) {
    val1_p_local._7_1_ = '\x01';
  }
  else {
    val1_p_local._7_1_ = '\0';
  }
  return val1_p_local._7_1_;
}

Assistant:

ly_bool
lyd_hash_table_val_equal(void *val1_p, void *val2_p, ly_bool mod, void *UNUSED(cb_data))
{
    struct lyd_node *val1, *val2;

    val1 = *((struct lyd_node **)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (mod) {
        if (val1 == val2) {
            return 1;
        } else {
            return 0;
        }
    }

    if (val1->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
        /* match on exact instance */
        if (!lyd_compare_single(val1, val2, 0)) {
            return 1;
        }
    } else if (val1->schema == val2->schema) {
        /* just schema match */
        return 1;
    }
    return 0;
}